

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

GLuint __thiscall rengine::OpenGLRenderer::TexturePool::acquire(TexturePool *this)

{
  bool bVar1;
  reference pvVar2;
  GLuint local_1c;
  TexturePool *pTStack_18;
  GLuint id;
  TexturePool *this_local;
  
  pTStack_18 = this;
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  if (bVar1) {
    glGenTextures(1,&local_1c);
    this_local._4_4_ = local_1c;
  }
  else {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                       (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    local_1c = *pvVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

GLuint acquire() {
            GLuint id;
            if (empty()) {
                glGenTextures(1, &id);
                return id;
            }
            id = back();
            pop_back();
            return id;
        }